

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

void __thiscall
tst_SerialiserCommon::saveLoadString
          (tst_SerialiserCommon *this,AbstractStringSerialiser *serialiser,
          QAbstractItemModel *sourceModel,QAbstractItemModel *destinationModel,bool multiRole,
          bool checkHeaders)

{
  byte bVar1;
  QModelIndex local_88;
  QModelIndex local_70;
  undefined4 local_58;
  undefined1 local_48 [8];
  QString dataString;
  bool checkHeaders_local;
  bool multiRole_local;
  QAbstractItemModel *destinationModel_local;
  QAbstractItemModel *sourceModel_local;
  AbstractStringSerialiser *serialiser_local;
  tst_SerialiserCommon *this_local;
  
  dataString.d.size._6_1_ = checkHeaders;
  dataString.d.size._7_1_ = multiRole;
  AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
  if ((dataString.d.size._7_1_ & 1) != 0) {
    (**(code **)(*(long *)serialiser + 0x70))(serialiser,0x101);
  }
  QString::QString((QString *)local_48);
  bVar1 = (**(code **)(*(long *)serialiser + 0xc0))(serialiser,local_48);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser->saveModel(&dataString)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x2a);
  if ((bVar1 & 1) == 0) {
    local_58 = 1;
  }
  else {
    AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
    bVar1 = AbstractStringSerialiser::loadModel((QString *)serialiser);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser->loadModel(dataString)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                           ,0x2c);
    if ((bVar1 & 1) == 0) {
      local_58 = 1;
    }
    else {
      QModelIndex::QModelIndex(&local_70);
      QModelIndex::QModelIndex(&local_88);
      checkModelEqual(this,sourceModel,destinationModel,&local_70,&local_88,
                      (bool)(dataString.d.size._6_1_ & 1));
      local_58 = 0;
    }
  }
  QString::~QString((QString *)local_48);
  return;
}

Assistant:

void tst_SerialiserCommon::saveLoadString(AbstractStringSerialiser *serialiser, const QAbstractItemModel *sourceModel,
                                          QAbstractItemModel *destinationModel, bool multiRole, bool checkHeaders) const
{
    serialiser->setModel(sourceModel);
    if (multiRole)
        serialiser->addRoleToSave(Qt::UserRole + 1);
    QString dataString;
    QVERIFY(serialiser->saveModel(&dataString));
    serialiser->setModel(destinationModel);
    QVERIFY(serialiser->loadModel(dataString));
    checkModelEqual(sourceModel, destinationModel, QModelIndex(), QModelIndex(), checkHeaders);
}